

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall CodeGenGenericContext::KillUnreadRegisters(CodeGenGenericContext *this)

{
  undefined4 local_18;
  undefined4 local_14;
  uint i_1;
  uint i;
  CodeGenGenericContext *this_local;
  
  for (local_14 = rNONE; local_14 < rRegCount; local_14 = local_14 + rEAX) {
    KillRegister(this,local_14);
  }
  for (local_18 = rXMM0; local_18 < rXmmRegCount; local_18 = local_18 + rXMM1) {
    KillRegister(this,local_18);
  }
  return;
}

Assistant:

void CodeGenGenericContext::KillUnreadRegisters()
{
	for(unsigned i = 0; i < rRegCount; i++)
		KillRegister(x86Reg(i));

	for(unsigned i = 0; i < rXmmRegCount; i++)
		KillRegister(x86XmmReg(i));
}